

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParseCommand(WastParser *this,Script *script,CommandPtr *out_command)

{
  TokenType TVar1;
  CommandPtr *out_command_local;
  Script *script_local;
  WastParser *this_local;
  
  TVar1 = Peek(this,1);
  switch(TVar1) {
  case AssertExhaustion:
    this_local._4_4_ = ParseAssertExhaustionCommand(this,out_command);
    break;
  case AssertInvalid:
    this_local._4_4_ = ParseAssertInvalidCommand(this,out_command);
    break;
  case AssertMalformed:
    this_local._4_4_ = ParseAssertMalformedCommand(this,out_command);
    break;
  case AssertReturn:
    this_local._4_4_ = ParseAssertReturnCommand(this,out_command);
    break;
  case AssertTrap:
    this_local._4_4_ = ParseAssertTrapCommand(this,out_command);
    break;
  case AssertUnlinkable:
    this_local._4_4_ = ParseAssertUnlinkableCommand(this,out_command);
    break;
  default:
    __assert_fail("!\"ParseCommand should only be called when IsCommand() is true\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                  ,0xaa3,"Result wabt::WastParser::ParseCommand(Script *, CommandPtr *)");
  case Get:
  case Invoke:
    this_local._4_4_ = ParseActionCommand(this,out_command);
    break;
  case Module:
    this_local._4_4_ = ParseModuleCommand(this,script,out_command);
    break;
  case Register:
    this_local._4_4_ = ParseRegisterCommand(this,out_command);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParseCommand(Script* script, CommandPtr* out_command) {
  WABT_TRACE(ParseCommand);
  switch (Peek(1)) {
    case TokenType::AssertExhaustion:
      return ParseAssertExhaustionCommand(out_command);

    case TokenType::AssertInvalid:
      return ParseAssertInvalidCommand(out_command);

    case TokenType::AssertMalformed:
      return ParseAssertMalformedCommand(out_command);

    case TokenType::AssertReturn:
      return ParseAssertReturnCommand(out_command);

    case TokenType::AssertTrap:
      return ParseAssertTrapCommand(out_command);

    case TokenType::AssertUnlinkable:
      return ParseAssertUnlinkableCommand(out_command);

    case TokenType::Get:
    case TokenType::Invoke:
      return ParseActionCommand(out_command);

    case TokenType::Module:
      return ParseModuleCommand(script, out_command);

    case TokenType::Register:
      return ParseRegisterCommand(out_command);

    default:
      assert(!"ParseCommand should only be called when IsCommand() is true");
      return Result::Error;
  }
}